

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQInteger sqstd_rex_parsenumber(SQRex *exp)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  
  lVar1 = (long)*exp->_p;
  pcVar2 = exp->_p + 1;
  exp->_p = pcVar2;
  lVar3 = 10;
  while( true ) {
    if (9 < (int)*pcVar2 - 0x30U) {
      return lVar1 + -0x30;
    }
    exp->_p = pcVar2 + 1;
    if (lVar3 == 1000000000) break;
    lVar1 = (lVar1 + -0x30) * 10 + (long)*pcVar2;
    lVar3 = lVar3 * 10;
    pcVar2 = pcVar2 + 1;
  }
  sqstd_rex_error(exp,"overflow in numeric constant");
}

Assistant:

static SQInteger sqstd_rex_parsenumber(SQRex *exp)
{
    SQInteger ret = *exp->_p-'0';
    SQInteger positions = 10;
    exp->_p++;
    while(isdigit(*exp->_p)) {
        ret = ret*10+(*exp->_p++-'0');
        if(positions==1000000000) sqstd_rex_error(exp,_SC("overflow in numeric constant"));
        positions *= 10;
    };
    return ret;
}